

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O3

void __thiscall QCborContainerPrivate::removeAt(QCborContainerPrivate *this,qsizetype idx)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.n = 0;
  local_38.container = (QCborContainerPrivate *)0x0;
  local_38.t = Undefined;
  replaceAt(this,idx,&local_38,CopyContainer);
  if (local_38.container != (QCborContainerPrivate *)0x0) {
    deref(local_38.container);
  }
  pDVar1 = (this->elements).d.d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QtCbor::Element>::reallocateAndGrow
              (&(this->elements).d,GrowsAtEnd,0,(QArrayDataPointer<QtCbor::Element> *)0x0);
  }
  QtPrivate::QPodArrayOps<QtCbor::Element>::erase
            ((QPodArrayOps<QtCbor::Element> *)&this->elements,(this->elements).d.ptr + idx,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void removeAt(qsizetype idx)
    {
        replaceAt(idx, {});
        elements.remove(idx);
    }